

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

CBString * Bstrlib::operator+(CBString *__return_storage_ptr__,char *a,CBString *b)

{
  CBString local_38;
  CBString *local_20;
  CBString *b_local;
  char *a_local;
  
  local_20 = b;
  b_local = (CBString *)a;
  a_local = (char *)__return_storage_ptr__;
  CBString::CBString(&local_38,a);
  CBString::operator+(__return_storage_ptr__,&local_38,local_20);
  CBString::~CBString(&local_38);
  return __return_storage_ptr__;
}

Assistant:

const CBString operator + (const char *a, const CBString& b) {
	return CBString(a) + b;
}